

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoHelperLinux.cpp
# Opt level: O0

string * __thiscall
license::CryptoHelperLinux::signString
          (string *__return_storage_ptr__,CryptoHelperLinux *this,void *privateKey,size_t pklen,
          string *license)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  logic_error *plVar2;
  BIO *bp;
  EVP_PKEY *pkey;
  EVP_MD *type;
  undefined8 uVar3;
  undefined8 uVar4;
  uchar *sigret;
  EVP_PKEY *pktmp;
  BIO *bio;
  EVP_MD_CTX *mdctx;
  uchar *signature;
  size_t slen;
  string *license_local;
  size_t pklen_local;
  void *privateKey_local;
  CryptoHelperLinux *this_local;
  string *signatureStr;
  
  slen = (size_t)license;
  license_local = (string *)pklen;
  pklen_local = (size_t)privateKey;
  privateKey_local = this;
  this_local = (CryptoHelperLinux *)__return_storage_ptr__;
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Message digest creation context");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bp = BIO_new_mem_buf((void *)pklen_local,(int)license_local);
  pkey = PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
  BIO_free(bp);
  type = EVP_sha256();
  iVar1 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pkey);
  if (iVar1 != 1) {
    EVP_MD_CTX_free(ctx);
  }
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::length();
  iVar1 = EVP_DigestSignUpdate(ctx,uVar3,uVar4);
  if (iVar1 != 1) {
    EVP_MD_CTX_free(ctx);
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Message signing exception");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  iVar1 = EVP_DigestSignFinal(ctx,(uchar *)0x0,(size_t *)&signature);
  if (iVar1 != 1) {
    EVP_MD_CTX_free(ctx);
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Message signature finalization exception");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  sigret = (uchar *)CRYPTO_malloc((int)signature,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/src/tools/base_lib/linux/CryptoHelperLinux.cpp"
                                  ,0x76);
  if (sigret != (uchar *)0x0) {
    iVar1 = EVP_DigestSignFinal(ctx,sigret,(size_t *)&signature);
    if (iVar1 == 1) {
      Opensslb64Encode_abi_cxx11_(__return_storage_ptr__,this,(size_t)signature,sigret);
      if (pkey != (EVP_PKEY *)0x0) {
        EVP_PKEY_free(pkey);
      }
      if (sigret != (uchar *)0x0) {
        CRYPTO_free(sigret);
      }
      if (ctx != (EVP_MD_CTX *)0x0) {
        EVP_MD_CTX_free(ctx);
      }
      return __return_storage_ptr__;
    }
    CRYPTO_free(sigret);
    EVP_MD_CTX_free(ctx);
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Message signature exception");
    __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  EVP_MD_CTX_free(ctx);
  plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar2,"Message signature memory allocation exception");
  __cxa_throw(plVar2,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

string CryptoHelperLinux::signString(const void* privateKey,
		size_t pklen, const string& license) const {
	size_t slen;
	unsigned char* signature;
	signature = NULL;
	/* Create the Message Digest Context */
	EVP_MD_CTX* mdctx = EVP_MD_CTX_create();
	if (!mdctx) {
		throw logic_error("Message digest creation context");
	}

	BIO* bio = BIO_new_mem_buf((void*) (privateKey), pklen);
	EVP_PKEY *pktmp = PEM_read_bio_PrivateKey(bio, NULL, NULL, NULL);
	BIO_free(bio);
	/*Initialise the DigestSign operation - SHA-256 has been selected
	 * as the message digest function in this example */
	if (1 != EVP_DigestSignInit(mdctx, NULL, EVP_sha256(), NULL, pktmp)) {
		EVP_MD_CTX_destroy(mdctx);
	}
	/* Call update with the message */
	if (EVP_DigestSignUpdate(mdctx, (const void* ) license.c_str(),
			(size_t ) license.length())
			!= 1) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signing exception");
	}
	/* Finalise the DigestSign operation */
	/* First call EVP_DigestSignFinal with a NULL sig parameter to obtain the length of the
	 * signature. Length is returned in slen */
	if (EVP_DigestSignFinal(mdctx, NULL, &slen) != 1) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature finalization exception");
	}
	/* Allocate memory for the signature based on size in slen */
	if (!(signature = (unsigned char *) OPENSSL_malloc(
			sizeof(unsigned char) * slen))) {
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature memory allocation exception");
	}
	/* Obtain the signature */
	if (1 != EVP_DigestSignFinal(mdctx, signature, &slen)) {
		OPENSSL_free(signature);
		EVP_MD_CTX_destroy(mdctx);
		throw logic_error("Message signature exception");
	}
	/*
	 FILE*  stream = fmemopen(*buffer, encodedSize+1, "w");
	 */
	//bio = BIO_new_fp(stdout, BIO_NOCLOSE);
	/*int encodedSize = 4 * ceil(slen / 3);
	 char* buffer = (char*) (malloc(encodedSize + 1));
	 memset(buffer,0,encodedSize+1);*/
	string signatureStr = Opensslb64Encode(slen, signature);
	/*
	 * BIO *bio, *b64;
	 char message[] = "Hello World \n";
	 b64 = BIO_new(BIO_f_base64());
	 bio = BIO_new_fp(stdout, BIO_NOCLOSE);
	 bio = BIO_push(b64, bio);
	 BIO_write(bio, message, strlen(message));
	 BIO_flush(bio);
	 BIO_free_all(bio);
	 Read Base64 encoded data from standard input and write the decoded data to standard output:

	 BIO *bio, *b64, *bio_out;
	 char inbuf[512];
	 int inlen;
	 b64 = BIO_new(BIO_f_base64());
	 bio = BIO_new_fp(stdin, BIO_NOCLOSE);
	 bio_out = BIO_new_fp(stdout, BIO_NOCLOSE);
	 bio = BIO_push(b64, bio);
	 while((inlen = BIO_read(bio, inbuf, 512)) > 0)
	 BIO_write(bio_out, inbuf, inlen);
	 BIO_free_all(bio);
	 */
	/* Clean up */
	//free(buffer);
	if (pktmp)
		EVP_PKEY_free(pktmp);
	if (signature)
		OPENSSL_free(signature);

	if (mdctx)
		EVP_MD_CTX_destroy(mdctx);
	return signatureStr;
}